

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

Maybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> __thiscall
kj::anon_unknown_59::InMemoryDirectory::Impl::openEntry(Impl *this,StringPtr name,WriteMode mode)

{
  char *pcVar1;
  size_t sVar2;
  int iVar3;
  iterator iVar4;
  Clock *pCVar5;
  EntryImpl *extraout_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 in_register_0000000c;
  char *pcVar6;
  key_type *__x;
  uint in_R8D;
  _Base_ptr *pp_Var7;
  __enable_if_t<is_constructible<value_type,_pair<StringPtr,_EntryImpl>_>::value,_pair<iterator,_bool>_>
  _Var8;
  String local_d8;
  long local_b8;
  undefined8 uStack_b0;
  ArrayDisposer *local_a8;
  OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
  local_a0;
  pair<kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl> local_70;
  
  pcVar6 = name.content.ptr;
  iVar4._M_node =
       (_Base_ptr)
       heapString(&local_d8,(char *)name.content.size_,CONCAT44(in_register_0000000c,mode) - 1);
  sVar2 = local_d8.content.size_;
  pcVar1 = local_d8.content.ptr;
  if ((in_R8D & 1) == 0) {
    if ((in_R8D & 2) == 0) {
      this->clock = (Clock *)0x0;
    }
    else {
      __x = (key_type *)local_d8.content.ptr;
      if (local_d8.content.size_ == 0) {
        __x = (key_type *)0x524569;
      }
      iVar4 = std::
              map<kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>_>_>
              ::find((map<kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>_>_>
                      *)(pcVar6 + 0x10),__x);
      pCVar5 = (Clock *)0x0;
      if (iVar4._M_node != (_Base_ptr)(pcVar6 + 0x18)) {
        pCVar5 = (Clock *)&iVar4._M_node[1]._M_left;
      }
      this->clock = pCVar5;
    }
  }
  else {
    local_a8 = local_d8.content.disposer;
    local_d8.content.ptr = (char *)0x0;
    local_d8.content.size_ = 0;
    local_a0.tag = 0;
    local_70.first.content.ptr = (char *)(key_type *)0x524569;
    if (sVar2 != 0) {
      local_70.first.content.ptr = pcVar1;
    }
    local_70.first.content.size_ = sVar2 + (sVar2 == 0);
    local_70.second.name.content.ptr = pcVar1;
    local_70.second.name.content.size_ = sVar2;
    local_70.second.name.content.disposer = local_d8.content.disposer;
    local_b8 = 0;
    uStack_b0 = 0;
    local_70.second.node.tag = 0;
    _Var8 = std::
            map<kj::StringPtr,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>>>
            ::
            insert<std::pair<kj::StringPtr,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>>
                      ((map<kj::StringPtr,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>>>
                        *)(pcVar6 + 0x10),&local_70);
    OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
    ::destroy(&local_70.second.node);
    if ((key_type *)local_70.second.name.content.ptr != (key_type *)0x0) {
      (**(local_70.second.name.content.disposer)->_vptr_ArrayDisposer)
                (local_70.second.name.content.disposer,local_70.second.name.content.ptr,1,
                 local_70.second.name.content.size_,local_70.second.name.content.size_,0);
    }
    pp_Var7 = &_Var8.first._M_node._M_node[1]._M_left;
    pCVar5 = (Clock *)0x0;
    if (((undefined1  [16])_Var8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pCVar5 = (Clock *)pp_Var7;
    }
    if ((in_R8D & 2) != 0) {
      pCVar5 = (Clock *)pp_Var7;
    }
    this->clock = pCVar5;
    OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
    ::destroy(&local_a0);
    iVar4._M_node = (_Base_ptr)extraout_RAX;
    if (local_b8 != 0) {
      iVar3 = (**local_a8->_vptr_ArrayDisposer)(local_a8,local_b8,1,uStack_b0,uStack_b0,0);
      iVar4._M_node = (_Base_ptr)CONCAT44(extraout_var,iVar3);
    }
  }
  sVar2 = local_d8.content.size_;
  pcVar1 = local_d8.content.ptr;
  if ((key_type *)local_d8.content.ptr != (key_type *)0x0) {
    local_d8.content.ptr = (char *)0x0;
    local_d8.content.size_ = 0;
    iVar3 = (**(local_d8.content.disposer)->_vptr_ArrayDisposer)
                      (local_d8.content.disposer,pcVar1,1,sVar2,sVar2,0);
    iVar4._M_node = (_Base_ptr)CONCAT44(extraout_var_00,iVar3);
  }
  return (Maybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&>)iVar4._M_node;
}

Assistant:

Maybe<EntryImpl&> openEntry(kj::StringPtr name, WriteMode mode) {
      // TODO(perf): We could avoid a copy if the entry exists, at the expense of a double-lookup
      //   if it doesn't. Maybe a better map implementation will solve everything?
      return openEntry(heapString(name), mode);
    }